

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O3

void __thiscall
CoreML::Specification::BranchLayerParams::SerializeWithCachedSizes
          (BranchLayerParams *this,CodedOutputStream *output)

{
  if (this->ifbranch_ != (NeuralNetwork *)0x0 &&
      this != (BranchLayerParams *)&_BranchLayerParams_default_instance_) {
    google::protobuf::internal::WireFormatLite::WriteMessage
              (1,&this->ifbranch_->super_MessageLite,output);
  }
  if (this->elsebranch_ != (NeuralNetwork *)0x0 &&
      this != (BranchLayerParams *)&_BranchLayerParams_default_instance_) {
    google::protobuf::internal::WireFormatLite::WriteMessage
              (2,&this->elsebranch_->super_MessageLite,output);
    return;
  }
  return;
}

Assistant:

void BranchLayerParams::SerializeWithCachedSizes(
    ::google::protobuf::io::CodedOutputStream* output) const {
  // @@protoc_insertion_point(serialize_start:CoreML.Specification.BranchLayerParams)
  ::google::protobuf::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  // .CoreML.Specification.NeuralNetwork ifBranch = 1;
  if (this->has_ifbranch()) {
    ::google::protobuf::internal::WireFormatLite::WriteMessage(
      1, *this->ifbranch_, output);
  }

  // .CoreML.Specification.NeuralNetwork elseBranch = 2;
  if (this->has_elsebranch()) {
    ::google::protobuf::internal::WireFormatLite::WriteMessage(
      2, *this->elsebranch_, output);
  }

  // @@protoc_insertion_point(serialize_end:CoreML.Specification.BranchLayerParams)
}